

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cinatra::press_tool::split
            (string *str,string *delimiter,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *elems)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string token;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  while( true ) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      (size_type)in_stack_ffffffffffffff80);
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80,
               (size_type)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffc0;
    in_stack_ffffffffffffff80 = &local_60;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff70 = this;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 = in_RDI;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length(in_RSI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78,
               (size_type)in_stack_ffffffffffffff70);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (size_type)in_stack_ffffffffffffff80);
  if (sVar2 == 0xffffffffffffffff) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1540a5
                      );
    if (!bVar1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  return in_RDX;
}

Assistant:

inline std::vector<std::string> &split(std::string &str,
                                       const std::string &delimiter,
                                       std::vector<std::string> &elems) {
  size_t pos = 0;
  std::string token;
  while ((pos = str.find(delimiter)) != std::string::npos) {
    token = str.substr(0, pos);
    elems.emplace_back(token);
    str.erase(0, pos + delimiter.length());
  }
  if (str.find(delimiter) == std::string::npos && !str.empty()) {
    elems.emplace_back(str);
  }
  return elems;
}